

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O2

void __thiscall
StrongConnectedComponents::makeAdjListSubgraph(StrongConnectedComponents *this,int node)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int currentNode;
  size_type local_40;
  long local_38;
  
  this_00 = &this->adjList;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(this_00);
  local_40 = (size_type)
             (int)(((long)(this->adjListOriginal->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->adjListOriginal->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(this_00,local_40);
  lVar2 = (long)node;
  while (lVar2 < (long)local_40) {
    pvVar1 = (this->adjListOriginal->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)((long)*(pointer *)
                           ((long)&pvVar1[lVar2].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) -
                   *(long *)&pvVar1[lVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl) >>
            2;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    local_38 = lVar2;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      currentNode = *(int *)(*(long *)&(this->adjListOriginal->
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[lVar2].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl +
                            uVar3 * 4);
      if (node <= currentNode) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((this_00->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar2,&currentNode);
      }
    }
    lVar2 = local_38 + 1;
  }
  return;
}

Assistant:

void StrongConnectedComponents::makeAdjListSubgraph(const int node) {
    adjList.clear();
    const int adjListSize = adjListOriginal.size();
    adjList.resize(adjListSize);

    for (int i = node; i < adjListSize; i++) {
        const int adjListOriginalISize = adjListOriginal[i].size();
        for (int j = 0; j < adjListOriginalISize; j++) {
            const int currentNode = adjListOriginal[i][j];
            if (currentNode >= node) {
                adjList[i].push_back(currentNode);
            }
        }
    }
}